

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool slang::ast::withAfterDynamic
               (StreamingConcatenationExpression *lhs,SourceRange **dynamic,SourceRange **with)

{
  pointer pSVar1;
  StreamingConcatenationExpression *lhs_00;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  pSVar1 = (lhs->streams_)._M_ptr;
  lVar5 = (lhs->streams_)._M_extent._M_extent_value * 0x18;
  for (lVar4 = 0; lVar5 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    lhs_00 = *(StreamingConcatenationExpression **)((long)&(pSVar1->operand).ptr + lVar4);
    if ((lhs_00->super_Expression).kind == Streaming) {
      bVar3 = withAfterDynamic(lhs_00,dynamic,with);
      if (bVar3) break;
    }
    else {
      lVar2 = *(long *)((long)&pSVar1->withExpr + lVar4);
      if (lVar2 == 0) {
        if ((*dynamic == (SourceRange *)0x0) &&
           (bVar3 = Type::isFixedSize((lhs_00->super_Expression).type.ptr), !bVar3)) {
          *dynamic = &(lhs_00->super_Expression).sourceRange;
        }
      }
      else {
        *with = (SourceRange *)(lVar2 + 0x20);
        if (*dynamic != (SourceRange *)0x0) break;
      }
    }
  }
  return lVar5 - lVar4 != 0;
}

Assistant:

static bool withAfterDynamic(const StreamingConcatenationExpression& lhs,
                             const SourceRange*& dynamic, const SourceRange*& with) {
    // The expression within the "with" is evaluated immediately before its corresponding array is
    // streamed. The first dynamically sized item without "with" constraints accept all the
    // available data. If the former appears after the latter, evaluation order has conflict.
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            if (withAfterDynamic(operand.as<StreamingConcatenationExpression>(), dynamic, with))
                return true;
        }
        else if (stream.withExpr) {
            with = &stream.withExpr->sourceRange;
            if (dynamic)
                return true;
        }
        else if (!dynamic && !operand.type->isFixedSize()) {
            dynamic = &operand.sourceRange;
        }
    }
    return false;
}